

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QSimplexConstraint_*>::growAppend
          (QCommonArrayOps<QSimplexConstraint_*> *this,QSimplexConstraint **b,QSimplexConstraint **e
          )

{
  QSimplexConstraint **ppQVar1;
  QSimplexConstraint ***data;
  QArrayDataPointer<QSimplexConstraint_*> *old;
  long in_FS_OFFSET;
  QArrayDataPointer<QSimplexConstraint_*> local_38;
  QSimplexConstraint **local_20;
  long local_18;
  
  old = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (QSimplexConstraint **)0x0;
    local_38.size = 0;
    ppQVar1 = (this->super_Type).super_QArrayDataPointer<QSimplexConstraint_*>.ptr;
    if ((b < ppQVar1) ||
       (ppQVar1 + (this->super_Type).super_QArrayDataPointer<QSimplexConstraint_*>.size <= b)) {
      data = (QSimplexConstraint ***)0x0;
      old = (QArrayDataPointer<QSimplexConstraint_*> *)0x0;
    }
    else {
      data = &local_20;
    }
    QArrayDataPointer<QSimplexConstraint_*>::detachAndGrow
              ((QArrayDataPointer<QSimplexConstraint_*> *)this,GrowsAtEnd,(long)e - (long)b >> 3,
               data,old);
    QPodArrayOps<QSimplexConstraint_*>::copyAppend
              (&this->super_Type,local_20,
               (QSimplexConstraint **)(((long)e - (long)b) + (long)local_20));
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }